

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilut.h
# Opt level: O1

void Mini_LutPush(Mini_Lut_t *p,int nVars,int *pVars,uint *pTruth)

{
  int iVar1;
  int *piVar2;
  uint *puVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int nCapMin;
  uint uVar8;
  
  iVar1 = p->LutSize;
  uVar4 = 1 << ((byte)(iVar1 - 5U) & 0x1f);
  if (iVar1 < 6) {
    uVar4 = 1;
  }
  iVar7 = p->nCap;
  if (p->nSize == iVar7) {
    if (0x3ffffffe < p->nSize * iVar1) {
      __assert_fail("p->LutSize*p->nSize < MINI_LUT_NULL/2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/minilut.h"
                    ,0x5d,"void Mini_LutPush(Mini_Lut_t *, int, int *, unsigned int *)");
    }
    nCapMin = iVar7 * 2;
    if (iVar7 < 0xff) {
      nCapMin = 0xff;
    }
    Mini_LutGrow(p,nCapMin);
  }
  if (0 < nVars) {
    uVar6 = 0;
    do {
      if ((pVars[uVar6] < 0) || (p->nSize <= pVars[uVar6])) {
        __assert_fail("pVars[i] >= 0 && pVars[i] < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/minilut.h"
                      ,100,"void Mini_LutPush(Mini_Lut_t *, int, int *, unsigned int *)");
      }
      uVar6 = uVar6 + 1;
    } while ((uint)nVars != uVar6);
  }
  if (nVars < 1) {
    uVar6 = 0;
  }
  else {
    piVar2 = p->pArray;
    uVar6 = 0;
    do {
      piVar2[(long)p->nSize * (long)p->LutSize + uVar6] = pVars[uVar6];
      uVar6 = uVar6 + 1;
    } while ((uint)nVars != uVar6);
  }
  iVar7 = p->LutSize;
  if ((int)uVar6 < iVar7) {
    piVar2 = p->pArray;
    uVar6 = uVar6 & 0xffffffff;
    do {
      piVar2[(long)iVar7 * (long)p->nSize + uVar6] = 0x7fffffff;
      iVar7 = p->LutSize;
      uVar6 = uVar6 + 1;
    } while ((int)uVar6 < iVar7);
  }
  if (0 < (int)uVar4) {
    uVar5 = 0;
    puVar3 = p->pTruths;
    uVar6 = (ulong)(iVar1 - 5U);
    if (iVar1 < 6) {
      uVar6 = uVar5;
    }
    do {
      uVar8 = 0;
      if (pTruth != (uint *)0x0) {
        uVar8 = pTruth[uVar5];
      }
      puVar3[(long)(p->nSize << ((byte)uVar6 & 0x1f)) + uVar5] = uVar8;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  p->nSize = p->nSize + 1;
  return;
}

Assistant:

static void Mini_LutPush( Mini_Lut_t * p, int nVars, int * pVars, unsigned * pTruth )
{
    int i, nWords = Mini_LutWordNum(p->LutSize);
    if ( p->nSize == p->nCap )
    {
        assert( p->LutSize*p->nSize < MINI_LUT_NULL/2 );
        if ( p->nCap < MINI_LUT_START_SIZE )
            Mini_LutGrow( p, MINI_LUT_START_SIZE );
        else
            Mini_LutGrow( p, 2 * p->nCap );
    }
    for ( i = 0; i < nVars; i++ )
        assert( pVars[i] >= 0 && pVars[i] < p->nSize );
    for ( i = 0; i < nVars; i++ )
        p->pArray[p->LutSize * p->nSize + i] = pVars[i];
    for ( ; i < p->LutSize; i++ )
        p->pArray[p->LutSize * p->nSize + i] = MINI_LUT_NULL;
    for ( i = 0; i < nWords; i++ )
        p->pTruths[nWords * p->nSize + i] = pTruth? pTruth[i] : 0;
    p->nSize++;
}